

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# light_io.c
# Opt level: O2

light_pcapng light_read_stream(light_pcapng_stream pcapng)

{
  uint32_t uVar1;
  int iVar2;
  uint32_t *memory;
  light_pcapng p_Var3;
  ulong __size;
  uint32_t block_total_length;
  uint32_t block_type;
  
  block_type = 0;
  block_total_length = 0;
  if ((pcapng != (light_pcapng_stream)0x0) && (pcapng->valid != 0)) {
    if (pcapng->current_block != (light_pcapng)0x0) {
      light_pcapng_release(pcapng->current_block);
      pcapng->current_block = (_light_pcapng *)0x0;
    }
    iVar2 = light_read((pcapng->stream).fd,&block_type,4);
    if ((iVar2 != -1) &&
       (iVar2 = light_read((pcapng->stream).fd,&block_total_length,4), uVar1 = block_total_length,
       iVar2 != -1)) {
      __size = (ulong)block_total_length;
      memory = (uint32_t *)malloc(__size);
      if (memory != (uint32_t *)0x0) {
        *memory = block_type;
        memory[1] = uVar1;
        iVar2 = light_read((pcapng->stream).fd,memory + 2,__size - 8);
        if (iVar2 != -1) {
          p_Var3 = light_read_from_memory(memory,(ulong)block_total_length);
          pcapng->current_block = p_Var3;
          free(memory);
          return p_Var3;
        }
        free(memory);
      }
    }
    pcapng->valid = 0;
  }
  return (light_pcapng)0x0;
}

Assistant:

light_pcapng light_read_stream(light_pcapng_stream pcapng)
{
	uint32_t block_type = 0;
	uint32_t block_total_length = 0;
	uint32_t *block_data = NULL;

	if (pcapng == NULL || !pcapng->valid) {
		return NULL;
	}

	if (pcapng->current_block) {
		light_pcapng_release(pcapng->current_block);
		pcapng->current_block = NULL;
	}

	if (light_read(pcapng->stream.fd, &block_type, sizeof(block_type)) == -1 ||
			light_read(pcapng->stream.fd, &block_total_length, sizeof(block_total_length)) == -1) {
		pcapng->valid = 0;
		return NULL;
	}

	block_data = malloc(block_total_length);
	if (block_data == NULL) {
		pcapng->valid = 0;
		return NULL;
	}

	block_data[0] = block_type;
	block_data[1] = block_total_length;

	if (light_read(pcapng->stream.fd, &block_data[2], block_total_length - 2 * sizeof(uint32_t)) == -1) {
		free(block_data);
		pcapng->valid = 0;
		return NULL;
	}

	pcapng->current_block = light_read_from_memory(block_data, block_total_length);
	free(block_data);

	return pcapng->current_block;
}